

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_ExtPubkey_Test::DescriptorKeyInfo_Constructor_ExtPubkey_Test
          (DescriptorKeyInfo_Constructor_ExtPubkey_Test *this)

{
  DescriptorKeyInfo_Constructor_ExtPubkey_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DescriptorKeyInfo_Constructor_ExtPubkey_Test_008892e0;
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_ExtPubkey) {
  std::string extkey = "tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe";
  ExtPubkey pubkey(extkey);
  std::string parent_info = "[ef57314e/0'/1]";
  std::string path = "0/1/*";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), extkey.c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyBip32);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey, parent_info, path));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + extkey + "/" + path).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_TRUE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetExtPubkey().ToString().c_str(),  extkey.c_str());
  EXPECT_STREQ(key_info.GetBip32Path().c_str(),  ("/" + path).c_str());
}